

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.h
# Opt level: O2

void __thiscall gutil::IOException::IOException(IOException *this,string *message)

{
  allocator local_39;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"IO exception",&local_39);
  Exception::Exception(&this->super_Exception,&local_38,message);
  std::__cxx11::string::~string((string *)&local_38);
  *(undefined ***)&this->super_Exception = &PTR__Exception_00114ce0;
  return;
}

Assistant:

IOException(const std::string &message) :
      Exception("IO exception", message) { }